

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_add_seg_face(REF_CAVITY ref_cavity,REF_INT *seg_nodes)

{
  uint uVar1;
  REF_INT local_44;
  int local_40;
  int local_38;
  REF_INT local_2c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT face_nodes [3];
  REF_INT *seg_nodes_local;
  REF_CAVITY ref_cavity_local;
  
  if ((ref_cavity->tet_list->n != 0) && (ref_cavity->state == REF_CAVITY_UNKNOWN)) {
    if (ref_cavity->surf_node == -1) {
      local_38 = ref_cavity->node;
    }
    else {
      local_38 = ref_cavity->surf_node;
    }
    if (*seg_nodes != local_38) {
      if (ref_cavity->surf_node == -1) {
        local_40 = ref_cavity->node;
      }
      else {
        local_40 = ref_cavity->surf_node;
      }
      if (seg_nodes[1] != local_40) {
        local_2c = *seg_nodes;
        ref_private_macro_code_rss = seg_nodes[1];
        if (ref_cavity->surf_node == -1) {
          local_44 = ref_cavity->node;
        }
        else {
          local_44 = ref_cavity->surf_node;
        }
        face_nodes[0] = local_44;
        face_nodes._4_8_ = seg_nodes;
        uVar1 = ref_cavity_insert_face(ref_cavity,&local_2c);
        if (uVar1 == 0) {
          return 0;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0xad,"ref_cavity_add_seg_face",(ulong)uVar1,"add face for seg");
        return uVar1;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_add_seg_face(REF_CAVITY ref_cavity,
                                                  REF_INT *seg_nodes) {
  REF_INT face_nodes[3];

  if (ref_list_n(ref_cavity_tet_list(ref_cavity)) == 0) return REF_SUCCESS;
  if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  if (seg_nodes[0] == ref_cavity_seg_node(ref_cavity) ||
      seg_nodes[1] == ref_cavity_seg_node(ref_cavity))
    return REF_SUCCESS;

  face_nodes[0] = seg_nodes[0];
  face_nodes[1] = seg_nodes[1];
  face_nodes[2] = ref_cavity_seg_node(ref_cavity);

  RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "add face for seg");

  return REF_SUCCESS;
}